

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

void google::protobuf::compiler::cpp::ListAllFields
               (FileDescriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  int iVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this;
  int iVar2;
  Descriptor *d_00;
  FieldDescriptor *local_28;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  FileDescriptor *d_local;
  
  local_1c = 0;
  _i_1 = fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)d;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = FileDescriptor::message_type_count((FileDescriptor *)fields_local);
    if (iVar2 <= iVar1) break;
    d_00 = FileDescriptor::message_type((FileDescriptor *)fields_local,local_1c);
    ListAllFields(d_00,_i_1);
    local_1c = local_1c + 1;
  }
  local_20 = 0;
  while( true ) {
    iVar1 = local_20;
    iVar2 = FileDescriptor::extension_count((FileDescriptor *)fields_local);
    this = _i_1;
    if (iVar2 <= iVar1) break;
    local_28 = FileDescriptor::extension((FileDescriptor *)fields_local,local_20);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(this,&local_28);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void ListAllFields(const FileDescriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect file level message.
  for (int i = 0; i < d->message_type_count(); i++) {
    ListAllFields(d->message_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
}